

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O3

void __thiscall toml::source_location::source_location(source_location *this,region_base *reg)

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *this_01;
  long *plVar2;
  uint_least32_t uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  long *local_80;
  long local_78;
  long local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  long *local_50;
  undefined8 local_48;
  undefined2 local_40 [8];
  
  this->line_num_ = 1;
  this->column_num_ = 1;
  this->region_size_ = 1;
  this_00 = &this->file_name_;
  paVar1 = &(this->file_name_).field_2;
  (this->file_name_)._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"unknown file","");
  this_01 = &this->line_str_;
  local_58 = &(this->line_str_).field_2;
  (this->line_str_)._M_dataplus._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)this_01,"");
  if (reg == (region_base *)0x0) {
    return;
  }
  local_60 = paVar1;
  (*reg->_vptr_region_base[7])(&local_80,reg);
  local_50 = (long *)local_40;
  local_40[0] = 0x3f;
  local_48 = 1;
  bVar8 = true;
  if (local_78 == 1) {
    bVar8 = (char)*local_80 != '?';
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (!bVar8) goto LAB_00154a76;
  (*reg->_vptr_region_base[7])(&local_80,reg);
  plVar2 = local_80;
  piVar5 = __errno_location();
  iVar4 = *piVar5;
  *piVar5 = 0;
  uVar6 = strtoul((char *)plVar2,(char **)&local_50,10);
  uVar3 = (uint_least32_t)uVar6;
  if (local_50 == plVar2) {
    uVar7 = std::__throw_invalid_argument("stoul");
    plVar2 = (long *)(this_01->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_58) {
      operator_delete(plVar2,local_58->_M_allocated_capacity + 1);
    }
    plVar2 = (long *)(this_00->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar2 != local_60) {
      operator_delete(plVar2,local_60->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar7);
  }
  if (*piVar5 == 0) {
LAB_00154a49:
    *piVar5 = iVar4;
  }
  else if (*piVar5 == 0x22) {
    uVar3 = std::__throw_out_of_range("stoul");
    goto LAB_00154a49;
  }
  this->line_num_ = uVar3;
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
LAB_00154a76:
  iVar4 = (*reg->_vptr_region_base[9])(reg);
  this->column_num_ = iVar4 + 1;
  uVar3 = (*reg->_vptr_region_base[8])(reg);
  this->region_size_ = uVar3;
  (*reg->_vptr_region_base[5])(&local_80,reg);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  (*reg->_vptr_region_base[6])(&local_80,reg);
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_80);
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return;
}

Assistant:

explicit source_location(const detail::region_base* reg)
        : line_num_(1), column_num_(1), region_size_(1),
          file_name_("unknown file"), line_str_("")
    {
        if(reg)
        {
            if(reg->line_num() != detail::region_base().line_num())
            {
                line_num_ = static_cast<std::uint_least32_t>(
                        std::stoul(reg->line_num()));
            }
            column_num_  = static_cast<std::uint_least32_t>(reg->before() + 1);
            region_size_ = static_cast<std::uint_least32_t>(reg->size());
            file_name_   = reg->name();
            line_str_    = reg->line();
        }
    }